

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O3

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> QVar3;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  qreal qVar6;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_30 = *_a[1];
      iVar5 = 0;
      break;
    case 1:
      local_30 = CONCAT44(local_30._4_4_,*_a[1]);
      iVar5 = 1;
      break;
    case 2:
      pQVar4 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)_a[1];
LAB_003942da:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setBlurRadius((QGraphicsBlurEffect *)_o,*(qreal *)pQVar4);
        return;
      }
      goto LAB_0039435c;
    case 3:
      pQVar4 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)_a[1];
LAB_003942fc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setBlurHints((QGraphicsBlurEffect *)_o,
                     (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>)
                     pQVar4->super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>);
        return;
      }
      goto LAB_0039435c;
    default:
      goto switchD_003941ec_caseD_3;
    }
    local_20 = &local_30;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
    break;
  case ReadProperty:
    pQVar4 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)*_a;
    if (_id == 1) {
      QVar3.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
           (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
           QPixmapBlurFilter::blurHints(*(QPixmapBlurFilter **)(*(long *)(_o + 8) + 0xa8));
      pQVar4->super_QFlagsStorage<QGraphicsBlurEffect::BlurHint> =
           QVar3.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i;
    }
    else if (_id == 0) {
      qVar6 = QPixmapBlurFilter::radius(*(QPixmapBlurFilter **)(*(long *)(_o + 8) + 0xa8));
      *(qreal *)pQVar4 = qVar6;
    }
    break;
  case WriteProperty:
    pQVar4 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)*_a;
    if (_id == 1) goto LAB_003942fc;
    if (_id == 0) goto LAB_003942da;
    break;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == blurRadiusChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == blurHintsChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
switchD_003941ec_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0039435c:
  __stack_chk_fail();
}

Assistant:

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsBlurEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->blurHintsChanged((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        case 2: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setBlurHints((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(qreal )>(_a, &QGraphicsBlurEffect::blurRadiusChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(BlurHints )>(_a, &QGraphicsBlurEffect::blurHintsChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 1: QtMocHelpers::assignFlags<BlurHints>(_v, _t->blurHints()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setBlurHints(*reinterpret_cast<BlurHints*>(_v)); break;
        default: break;
        }
    }
}